

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# allocator_ion.c
# Opt level: O2

MPP_RET allocator_ion_free(void *ctx,MppBufferInfo *data)

{
  uint uVar1;
  RK_U32 RVar2;
  MPP_RET MVar3;
  undefined4 local_1c;
  
  if (ctx == (void *)0x0) {
    _mpp_log_l(2,"mpp_ion","do not accept NULL input\n","allocator_ion_free");
    MVar3 = MPP_ERR_NULL_PTR;
  }
  else {
    if ((ion_debug & 1) != 0) {
      _mpp_log_l(4,"mpp_ion","enter: ctx %p fd %d ptr %p size %d\n","allocator_ion_free",ctx,
                 (ulong)(uint)data->fd,data->ptr,data->size);
    }
    if (data->ptr != (void *)0x0) {
      munmap(data->ptr,data->size);
      data->ptr = (void *)0x0;
    }
    if (0 < data->fd) {
      close(data->fd);
      data->fd = -1;
    }
    RVar2 = ion_debug;
    if (data->hnd != (void *)0x0) {
      uVar1 = *(uint *)((long)ctx + 8);
      local_1c = SUB84(data->hnd,0);
      if ((ion_debug & 1) != 0) {
        _mpp_log_l(4,"mpp_ion","enter: fd %d\n","ion_free",(ulong)uVar1);
      }
      uVar1 = ion_ioctl(uVar1,-0x3ffbb6ff,&local_1c);
      if ((ion_debug & 1) != 0) {
        _mpp_log_l(4,"mpp_ion","leave: ret %d\n","ion_free",(ulong)uVar1);
      }
      RVar2 = ion_debug;
      data->hnd = (void *)0x0;
    }
    MVar3 = MPP_OK;
    if ((RVar2 & 1) != 0) {
      MVar3 = MPP_OK;
      _mpp_log_l(4,"mpp_ion","leave\n","allocator_ion_free");
    }
  }
  return MVar3;
}

Assistant:

static MPP_RET allocator_ion_free(void *ctx, MppBufferInfo *data)
{
    allocator_ctx_ion *p = NULL;
    if (NULL == ctx) {
        mpp_err_f("do not accept NULL input\n");
        return MPP_ERR_NULL_PTR;
    }

    ion_dbg_func("enter: ctx %p fd %d ptr %p size %d\n",
                 ctx, data->fd, data->ptr, data->size);

    p = (allocator_ctx_ion *)ctx;
    if (data->ptr) {
        munmap(data->ptr, data->size);
        data->ptr = NULL;
    }

    if (data->fd > 0) {
        close(data->fd);
        data->fd = -1;
    }

    if (data->hnd) {
        ion_free(p->ion_device, (ion_user_handle_t)((intptr_t)data->hnd));
        data->hnd = NULL;
    }

    ion_dbg_func("leave\n");
    return MPP_OK;
}